

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall
cmCTest::RunMakeCommand
          (cmCTest *this,char *command,string *output,int *retVal,char *dir,int timeout,ostream *ofs
          ,Encoding encoding)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  cmsysProcess *pcVar4;
  ostream *poVar5;
  ulong uVar6;
  char *pcVar7;
  long *plVar8;
  ulong uVar9;
  char **ppcVar10;
  long lVar11;
  const_iterator a;
  pointer pbVar12;
  cmProcessOutput processOutput;
  string strdata;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  int length;
  ostringstream cmCTestLog_msg;
  char *data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 auStack_278 [7];
  cmProcessOutput local_271;
  long *local_270;
  long local_260 [2];
  cmCTest *local_250;
  string local_248;
  string *local_228;
  cmsysProcess *local_220;
  char **local_218;
  iterator iStack_210;
  char **local_208;
  int *local_1f8;
  int local_1f0;
  int local_1ec;
  undefined1 local_1e8 [376];
  char *local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_250 = this;
  local_228 = output;
  local_220 = (cmsysProcess *)dir;
  local_1f0 = timeout;
  cmSystemTools::ParseArguments_abi_cxx11_(&local_48,(cmSystemTools *)command,(char *)output);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = 0;
    goto LAB_0028b569;
  }
  local_218 = (char **)0x0;
  iStack_210._M_current = (char **)0x0;
  local_208 = (char **)0x0;
  pbVar12 = local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1f8 = retVal;
  do {
    local_1e8._0_8_ = (pbVar12->_M_dataplus)._M_p;
    if (iStack_210._M_current == local_208) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_218,iStack_210,
                 (char **)local_1e8);
    }
    else {
      *iStack_210._M_current = (char *)local_1e8._0_8_;
      iStack_210._M_current = iStack_210._M_current + 1;
    }
    pbVar12 = pbVar12 + 1;
  } while (pbVar12 !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  local_1e8._0_8_ = (_func_int **)0x0;
  if (iStack_210._M_current == local_208) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_218,iStack_210,
               (char **)local_1e8);
  }
  else {
    *iStack_210._M_current = (char *)0x0;
    iStack_210._M_current = iStack_210._M_current + 1;
  }
  std::__cxx11::string::_M_replace((ulong)local_228,0,(char *)local_228->_M_string_length,0x66eafa);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"Run command:",0xc);
  std::__cxx11::stringbuf::str();
  Log(local_250,4,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x3d7,local_248._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
  if (local_218 != iStack_210._M_current) {
    ppcVar10 = local_218;
    do {
      if (*ppcVar10 == (char *)0x0) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," \"",2);
      pcVar7 = *ppcVar10;
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)auStack_278 + (int)*(_func_int **)(local_1e8._0_8_ + -0x18) + 0x90);
      }
      else {
        sVar3 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,pcVar7,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\"",1);
      std::__cxx11::stringbuf::str();
      Log(local_250,4,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x3da,local_248._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
      std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
      ppcVar10 = ppcVar10 + 1;
    } while (ppcVar10 != iStack_210._M_current);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  std::ios::widen((char)(ostringstream *)local_1e8 + (char)*(_func_int **)(local_1e8._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_1e8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_250,4,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x3dc,local_248._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
  pcVar4 = cmsysProcess_New();
  cmsysProcess_SetCommand(pcVar4,local_218);
  cmsysProcess_SetWorkingDirectory(pcVar4,(char *)local_220);
  cmsysProcess_SetOption(pcVar4,0,1);
  cmsysProcess_SetTimeout(pcVar4,(double)local_1f0);
  cmsysProcess_Execute(pcVar4);
  cmProcessOutput::cmProcessOutput(&local_271,encoding,0x400);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e8,"   Each . represents ",0x15);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," bytes of output",0x10);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    ",4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_250,3,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x3f1,(char *)local_270,false);
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
  uVar9 = 0;
  local_220 = pcVar4;
  while (iVar1 = cmsysProcess_WaitForData(pcVar4,&local_70,&local_1ec,(double *)0x0), iVar1 != 0) {
    cmProcessOutput::DecodeText(&local_271,local_70,(long)local_1ec,&local_248,0);
    if (local_248._M_string_length != 0) {
      uVar6 = 0;
      do {
        if (local_248._M_dataplus._M_p[uVar6] == '\0') {
          local_248._M_dataplus._M_p[uVar6] = '\n';
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_248._M_string_length);
    }
    std::__cxx11::string::_M_append((char *)local_228,(ulong)local_248._M_dataplus._M_p);
    uVar6 = uVar9 << 10;
    if (uVar6 < local_228->_M_string_length) {
      lVar11 = -uVar9;
      do {
        uVar9 = uVar9 + 1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".",1);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(local_250,3,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x3fc,(char *)local_270,false);
        if (local_270 != local_260) {
          operator_delete(local_270,local_260[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
        if ((lVar11 != 1) && ((uVar9 / 0x32) * -0x32 + 1 == lVar11)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"  Size: ",8);
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             ((ostringstream *)local_1e8,
                              (int)((((double)CONCAT44(0x45300000,
                                                       (int)(local_228->_M_string_length >> 0x20)) -
                                     1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)local_228->_M_string_length) -
                                    4503599627370496.0)) * 0.0009765625 + 1.0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"K",1);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          poVar5 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    ",4);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          Log(local_250,3,
              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
              ,0x401,(char *)local_270,false);
          if (local_270 != local_260) {
            operator_delete(local_270,local_260[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
        }
        lVar11 = lVar11 + -1;
        uVar6 = uVar6 + 0x400;
      } while (uVar6 < local_228->_M_string_length);
      uVar9 = -lVar11;
      pcVar4 = local_220;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    if (local_248._M_string_length != 0) {
      std::ostream::write((char *)local_1e8,(long)local_248._M_dataplus._M_p);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(local_250,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x405,(char *)local_270,false);
    if (local_270 != local_260) {
      operator_delete(local_270,local_260[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
    if ((((&ofs->field_0x20)[(long)ofs->_vptr_basic_ostream[-3]] & 5) == 0) &&
       (local_248._M_string_length != 0)) {
      std::ostream::write((char *)ofs,(long)local_248._M_dataplus._M_p);
      std::ostream::flush();
    }
  }
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  cmProcessOutput::DecodeText(&local_271,&local_68,&local_248,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  pcVar4 = local_220;
  if (local_248._M_string_length != 0) {
    std::__cxx11::string::_M_append((char *)local_228,(ulong)local_248._M_dataplus._M_p);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    if (local_248._M_string_length != 0) {
      std::ostream::write(local_1e8,(long)local_248._M_dataplus._M_p);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(local_250,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x40e,(char *)local_270,false);
    if (local_270 != local_260) {
      operator_delete(local_270,local_260[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
    if ((((&ofs->field_0x20)[(long)ofs->_vptr_basic_ostream[-3]] & 5) == 0) &&
       (local_248._M_string_length != 0)) {
      std::ostream::write((char *)ofs,(long)local_248._M_dataplus._M_p);
      std::ostream::flush();
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," Size of output: ",0x11);
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (local_1e8,
                      (int)((((double)CONCAT44(0x45300000,(int)(local_228->_M_string_length >> 0x20)
                                              ) - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)local_228->_M_string_length) -
                            4503599627370496.0)) * 0.0009765625));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"K",1);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_250,3,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x414,(char *)local_270,false);
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
  cmsysProcess_WaitForExit(pcVar4,(double *)0x0);
  iVar1 = cmsysProcess_GetState(pcVar4);
  switch(iVar1) {
  case 1:
    std::__cxx11::string::append((char *)local_228);
    cmsysProcess_GetErrorString(pcVar4);
    std::__cxx11::string::append((char *)local_228);
    std::__cxx11::string::append((char *)local_228);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"There was an error: ",0x14);
    pcVar7 = cmsysProcess_GetErrorString(local_220);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)auStack_278 + (int)*(_func_int **)(local_1e8._0_8_ + -0x18) + 0x90);
    }
    else {
      sVar3 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,pcVar7,sVar3);
    }
    std::ios::widen((char)(ostream *)local_1e8 + (char)*(_func_int **)(local_1e8._0_8_ + -0x18));
    std::ostream::put((char)local_1e8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_250,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x429,(char *)local_270,false);
    pcVar4 = local_220;
    break;
  case 2:
    iVar2 = cmsysProcess_GetExitException(pcVar4);
    *local_1f8 = iVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"There was an exception: ",0x18);
    plVar8 = (long *)std::ostream::operator<<(local_1e8,*local_1f8);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_250,5,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x421,(char *)local_270,false);
    break;
  default:
    goto switchD_0028b1c8_caseD_3;
  case 4:
    iVar2 = cmsysProcess_GetExitValue(pcVar4);
    *local_1f8 = iVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Command exited with the value: ",0x1f);
    plVar8 = (long *)std::ostream::operator<<(local_1e8,*local_1f8);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_250,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x41d,(char *)local_270,false);
    break;
  case 5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"There was a timeout",0x13);
    std::ios::widen((char)(ostream *)local_1e8 + (char)*(_func_int **)(local_1e8._0_8_ + -0x18));
    std::ostream::put((char)local_1e8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_250,5,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x423,(char *)local_270,false);
  }
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
switchD_0028b1c8_caseD_3:
  cmsysProcess_Delete(pcVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_271);
  if (local_218 != (char **)0x0) {
    operator_delete(local_218,(long)local_208 - (long)local_218);
  }
LAB_0028b569:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return iVar1;
}

Assistant:

int cmCTest::RunMakeCommand(const char* command, std::string& output,
                            int* retVal, const char* dir, int timeout,
                            std::ostream& ofs, Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  std::vector<const char*> argv;
  for (std::vector<std::string>::const_iterator a = args.begin();
       a != args.end(); ++a) {
    argv.push_back(a->c_str());
  }
  argv.push_back(CM_NULLPTR);

  output = "";
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Run command:");
  std::vector<const char*>::iterator ait;
  for (ait = argv.begin(); ait != argv.end() && *ait; ++ait) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, " \"" << *ait << "\"");
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, std::endl);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  std::string::size_type tick_len = 1024;
  std::string::size_type tick_line_len = 50;

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, "   Each . represents "
               << tick_len << " bytes of output" << std::endl
               << "    " << std::flush);
  while (cmsysProcess_WaitForData(cp, &data, &length, CM_NULLPTR)) {
    processOutput.DecodeText(data, length, strdata);
    for (size_t cc = 0; cc < strdata.size(); ++cc) {
      if (strdata[cc] == 0) {
        strdata[cc] = '\n';
      }
    }
    output.append(strdata);
    while (output.size() > (tick * tick_len)) {
      tick++;
      cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, "." << std::flush);
      if (tick % tick_line_len == 0 && tick > 0) {
        cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
                   "  Size: " << int((double(output.size()) / 1024.0) + 1)
                              << "K" << std::endl
                              << "    " << std::flush);
      }
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (ofs) {
      ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    output.append(strdata);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (ofs) {
      ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
    }
  }
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, " Size of output: "
               << int(double(output.size()) / 1024.0) << "K" << std::endl);

  cmsysProcess_WaitForExit(cp, CM_NULLPTR);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               "Command exited with the value: " << *retVal << std::endl);
  } else if (result == cmsysProcess_State_Exception) {
    *retVal = cmsysProcess_GetExitException(cp);
    cmCTestLog(this, WARNING, "There was an exception: " << *retVal
                                                         << std::endl);
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestLog(this, WARNING, "There was a timeout" << std::endl);
  } else if (result == cmsysProcess_State_Error) {
    output += "\n*** ERROR executing: ";
    output += cmsysProcess_GetErrorString(cp);
    output += "\n***The build process failed.";
    cmCTestLog(this, ERROR_MESSAGE, "There was an error: "
                 << cmsysProcess_GetErrorString(cp) << std::endl);
  }

  cmsysProcess_Delete(cp);

  return result;
}